

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtis(fitsfile *fptr,char *grpname,int grouptype,int *status)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  int *in_RCX;
  char *in_RSI;
  fitsfile *in_RDI;
  bool bVar4;
  char comment [73];
  char keyvalue [71];
  char keyword [75];
  char extname [9];
  char tformBuff [54];
  char ttypeBuff [102];
  char *tform [6];
  char *ttype [6];
  long pcount;
  int i;
  int extver;
  int hdutype;
  int hdunum;
  int tfields;
  char *s2;
  int *s1;
  int *in_stack_fffffffffffffdb8;
  char *in_stack_fffffffffffffdc0;
  int *in_stack_fffffffffffffdc8;
  char *in_stack_fffffffffffffdd0;
  fitsfile *in_stack_fffffffffffffdd8;
  int *in_stack_fffffffffffffde0;
  fitsfile *in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf4;
  fitsfile *in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffe04;
  fitsfile *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe18;
  int in_stack_fffffffffffffe1c;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  int in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  int in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  fitsfile *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe40;
  char **in_stack_fffffffffffffe48;
  char **in_stack_fffffffffffffe50;
  int *in_stack_fffffffffffffe58;
  int *in_stack_fffffffffffffe60;
  int *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  LONGLONG in_stack_fffffffffffffe78;
  char **in_stack_fffffffffffffe80;
  fitsfile *in_stack_fffffffffffffe88;
  char **in_stack_fffffffffffffe90;
  undefined3 in_stack_fffffffffffffe9c;
  undefined7 uVar5;
  undefined1 uVar6;
  fitsfile *in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffec0;
  LONGLONG in_stack_fffffffffffffec8;
  int *in_stack_fffffffffffffed0;
  undefined1 local_118 [112];
  long local_a8 [6];
  long local_78 [6];
  char *local_48;
  int local_3c;
  int local_38;
  undefined4 local_34;
  int local_30;
  int local_2c;
  int *local_28;
  char *local_18;
  fitsfile *local_10;
  
  local_2c = 0;
  local_30 = 0;
  local_34 = 0;
  local_48 = (char *)0x0;
  iVar2 = CONCAT13(0x47,in_stack_fffffffffffffe9c);
  uVar5 = 0x474e4950554f52;
  uVar6 = 0;
  for (local_3c = 0; local_3c < 6; local_3c = local_3c + 1) {
    local_78[local_3c] = (long)(local_118 + local_3c * 0x11);
    local_a8[local_3c] = (long)(&stack0xfffffffffffffea8 + local_3c * 9);
  }
  local_28 = in_RCX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = ffgtdc(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28,
                 in_stack_fffffffffffffe24,in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,
                 in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,
                 in_stack_fffffffffffffe58,in_stack_fffffffffffffe60);
  *local_28 = iVar1;
  s2 = local_48;
  s1 = local_28;
  iVar2 = ffibin(in_stack_fffffffffffffea8,CONCAT17(uVar6,uVar5),iVar2,in_stack_fffffffffffffe90,
                 (char **)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 in_stack_fffffffffffffec0,in_stack_fffffffffffffec8,in_stack_fffffffffffffed0);
  *local_28 = iVar2;
  if (*local_28 == 0) {
    ffghdn(local_10,&local_30);
    ffgkey(in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0,
           (char *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    ffikys(in_stack_fffffffffffffe38,
           (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
           (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
           (char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
           (int *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    ffikyj(in_stack_fffffffffffffe38,
           (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
           CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
           (char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
           (int *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    if ((local_18 != (char *)0x0) && (sVar3 = strlen(local_18), sVar3 != 0)) {
      ffikys(in_stack_fffffffffffffe38,
             (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
             (char *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             (char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (int *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    }
    local_3c = 0;
    while( true ) {
      bVar4 = false;
      if (local_3c < local_2c) {
        bVar4 = *local_28 == 0;
      }
      if (!bVar4) break;
      iVar2 = fits_strcasecmp((char *)s1,s2);
      if ((iVar2 == 0) || (iVar2 = fits_strcasecmp((char *)s1,s2), iVar2 == 0)) {
        snprintf(&stack0xfffffffffffffe48,0x4b,"TFORM%d",(ulong)(local_3c + 1));
        iVar2 = ffgkys(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                       (char *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                       in_stack_fffffffffffffdb8);
        *local_28 = iVar2;
        snprintf(&stack0xfffffffffffffe48,0x4b,"TNULL%d",(ulong)(local_3c + 1));
        iVar2 = ffikyj(in_stack_fffffffffffffe38,
                       (char *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                       CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                       (char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       (int *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
        *local_28 = iVar2;
      }
      local_3c = local_3c + 1;
    }
    local_38 = 1;
    while (iVar2 = ffmnhd(in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                          (char *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
                          &in_stack_fffffffffffffde8->HDUposition), iVar2 == 0) {
      local_38 = local_38 + 1;
    }
    if (*local_28 == 0x12d) {
      *local_28 = 0;
    }
    ffmahd(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
           &in_stack_fffffffffffffde8->HDUposition,in_stack_fffffffffffffde0);
    ffmkyj(in_stack_fffffffffffffe88,(char *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
           in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  }
  return *local_28;
}

Assistant:

int ffgtis(fitsfile *fptr,      /* FITS file pointer                         */
	   char    *grpname,    /* name of the grouping table                */
	   int      grouptype,  /* code specifying the type of
				   grouping table information:
				   GT_ID_ALL_URI  0 ==> defualt (all columns)
				   GT_ID_REF      1 ==> ID by reference
				   GT_ID_POS      2 ==> ID by position
				   GT_ID_ALL      3 ==> ID by ref. and position
				   GT_ID_REF_URI 11 ==> (1) + URI info 
				   GT_ID_POS_URI 12 ==> (2) + URI info       */
	   int      *status)     /* return status code                       */
	   
/* 
   insert a grouping table just after the current HDU of the current FITS file.
   This is the same as fits_create_group() only it allows the user to select
   the place within the FITS file to add the grouping table.
*/

{

  int tfields  = 0;
  int hdunum   = 0;
  int hdutype  = 0;
  int extver;
  int i;
  
  long pcount  = 0;

  char *ttype[6];
  char *tform[6];

  char ttypeBuff[102];  
  char tformBuff[54];  

  char  extname[] = "GROUPING";
  char  keyword[FLEN_KEYWORD];
  char  keyvalue[FLEN_VALUE];
  char  comment[FLEN_COMMENT];
    
  do
    {

      /* set up the ttype and tform character buffers */

      for(i = 0; i < 6; ++i)
	{
	  ttype[i] = ttypeBuff+(i*17);
	  tform[i] = tformBuff+(i*9);
	}

      /* define the columns required according to the grouptype parameter */

      *status = ffgtdc(grouptype,0,0,0,0,0,0,ttype,tform,&tfields,status);

      /* create the grouping table using the columns defined above */

      *status = fits_insert_btbl(fptr,0,tfields,ttype,tform,NULL,
				 NULL,pcount,status);

      if(*status != 0) continue;

      /*
	 retrieve the hdu position of the new grouping table for
	 future use
      */

      fits_get_hdu_num(fptr,&hdunum);

      /*
	 add the EXTNAME and EXTVER keywords to the HDU just after the 
	 TFIELDS keyword; for now the EXTVER value is set to 0, it will be 
	 set to the correct value later on
      */

      fits_read_keyword(fptr,"TFIELDS",keyvalue,comment,status);

      fits_insert_key_str(fptr,"EXTNAME",extname,
			  "HDU contains a Grouping Table",status);
      fits_insert_key_lng(fptr,"EXTVER",0,"Grouping Table vers. (this file)",
			  status);

      /* 
	 if the grpname parameter value was defined (Non NULL and non zero
	 length) then add the GRPNAME keyword and value
      */

      if(grpname != NULL && strlen(grpname) > 0)
	fits_insert_key_str(fptr,"GRPNAME",grpname,"Grouping Table name",
			    status);

      /* 
	 add the TNULL keywords and values for each integer column defined;
	 integer null values are zero (0) for the MEMBER_POSITION and 
	 MEMBER_VERSION columns.
      */

      for(i = 0; i < tfields && *status == 0; ++i)
	{	  
	  if(fits_strcasecmp(ttype[i],"MEMBER_POSITION") == 0 ||
	     fits_strcasecmp(ttype[i],"MEMBER_VERSION")  == 0)
	    {
	      snprintf(keyword,FLEN_KEYWORD,"TFORM%d",i+1);
	      *status = fits_read_key_str(fptr,keyword,keyvalue,comment,
					  status);
	 
	      snprintf(keyword,FLEN_KEYWORD,"TNULL%d",i+1);

	      *status = fits_insert_key_lng(fptr,keyword,0,"Column Null Value",
					    status);
	    }
	}

      /*
	 determine the correct EXTVER value for the new grouping table
	 by finding the highest numbered grouping table EXTVER value
	 the currently exists
      */

      for(extver = 1;
	  (fits_movnam_hdu(fptr,ANY_HDU,"GROUPING",extver,status)) == 0; 
	  ++extver);

      if(*status == BAD_HDU_NUM) *status = 0;

      /*
	 move back to the new grouping table HDU and update the EXTVER
	 keyword value
      */

      fits_movabs_hdu(fptr,hdunum,&hdutype,status);

      fits_modify_key_lng(fptr,"EXTVER",extver,"&",status);

    }while(0);


  return(*status);
}